

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverImpl.cpp
# Opt level: O0

bool Diligent::
     AddObjectToArchive<Diligent::SerializedResourceSignatureImpl,Diligent::IPipelineResourceSignature>
               (IPipelineResourceSignature *pObject,char *ObjectTypeStr,
               INTERFACE_ID *SerializedObjIID,mutex *Mtx,
               unordered_map<Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>_>_>
               *Objects)

{
  undefined *puVar1;
  bool bVar2;
  Char *pCVar3;
  char (*Args_1) [3];
  SerializedResourceSignatureImpl *pSVar4;
  PipelineResourceSignatureDesc *pPVar5;
  pointer ppVar6;
  SerializedResourceSignatureImpl *Rhs;
  undefined8 uVar7;
  char (*in_R9) [74];
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>,_false,_false>,_bool>
  pVar8;
  undefined1 local_f8 [8];
  string _msg;
  HashMapStringKey local_c8;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>,_false>
  local_b8;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>,_false,_false>,_bool>
  it_inserted;
  lock_guard<std::mutex> Guard;
  Char *Name;
  undefined1 local_90 [8];
  string msg_1;
  RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> pSerializedObj;
  undefined1 local_58 [8];
  string msg;
  unordered_map<Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>_>_>
  *Objects_local;
  mutex *Mtx_local;
  INTERFACE_ID *SerializedObjIID_local;
  char *ObjectTypeStr_local;
  IPipelineResourceSignature *pObject_local;
  
  msg.field_2._8_8_ = Objects;
  SerializedObjIID_local = (INTERFACE_ID *)ObjectTypeStr;
  ObjectTypeStr_local = (char *)pObject;
  if (pObject == (IPipelineResourceSignature *)0x0) {
    FormatString<char_const*,char[18]>
              ((string *)local_58,(Diligent *)&SerializedObjIID_local,(char **)0xe6a685,
               (char (*) [18])Mtx);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"AddObjectToArchive",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverImpl.cpp"
               ,0x109);
    std::__cxx11::string::~string((string *)local_58);
  }
  if (ObjectTypeStr_local == (char *)0x0) {
    pObject_local._7_1_ = 0;
    goto LAB_00210a4a;
  }
  RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> *)((long)&msg_1.field_2 + 8),
             (IObject *)ObjectTypeStr_local,SerializedObjIID);
  bVar2 = RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::operator!
                    ((RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> *)
                     ((long)&msg_1.field_2 + 8));
  if (bVar2) {
    Args_1 = (char (*) [3])(**(code **)(*(long *)ObjectTypeStr_local + 0x20))();
    FormatString<char_const*,char[3],char_const*,char[45]>
              ((string *)local_90,(Diligent *)&SerializedObjIID_local,(char **)0xe2ad31,Args_1,
               (char **)"\' was not created by a serialization device.",(char (*) [45])in_R9);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"AddObjectToArchive",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/ArchiverImpl.cpp"
               ,0x110);
    std::__cxx11::string::~string((string *)local_90);
    pObject_local._7_1_ = 0;
  }
  else {
    pSVar4 = RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::operator->
                       ((RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> *)
                        ((long)&msg_1.field_2 + 8));
    pPVar5 = SerializedResourceSignatureImpl::GetDesc(pSVar4);
    Guard._M_device = (mutex_type *)(pPVar5->super_DeviceObjectAttribs).Name;
    std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&it_inserted.second,Mtx);
    uVar7 = msg.field_2._8_8_;
    HashMapStringKey::HashMapStringKey(&local_c8,(Char *)Guard._M_device,true);
    pVar8 = std::
            unordered_map<Diligent::HashMapStringKey,Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>>>>
            ::
            emplace<Diligent::HashMapStringKey,Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>&>
                      ((unordered_map<Diligent::HashMapStringKey,Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>>>>
                        *)uVar7,&local_c8,
                       (RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> *)
                       ((long)&msg_1.field_2 + 8));
    _msg.field_2._8_8_ =
         pVar8.first.
         super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>,_false>
         ._M_cur;
    it_inserted.first.
    super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>,_false>
    ._M_cur._0_1_ = pVar8.second;
    local_b8._M_cur = (__node_type *)_msg.field_2._8_8_;
    HashMapStringKey::~HashMapStringKey(&local_c8);
    if (((byte)it_inserted.first.
               super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>,_false>
               ._M_cur & 1) == 0) {
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>,_false,_false>
                             *)&local_b8);
      bVar2 = RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::operator!=
                        (&ppVar6->second,
                         (RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> *)
                         ((long)&msg_1.field_2 + 8));
      if (!bVar2) goto LAB_00210a0a;
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>_>,_false,_false>
                             *)&local_b8);
      pSVar4 = RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::operator*(&ppVar6->second);
      Rhs = RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::operator*
                      ((RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> *)
                       ((long)&msg_1.field_2 + 8));
      bVar2 = SerializedResourceSignatureImpl::operator!=(pSVar4,Rhs);
      if (!bVar2) goto LAB_00210a0a;
      FormatString<char_const*,char[13],char_const*,char[74]>
                ((string *)local_f8,(Diligent *)&SerializedObjIID_local,(char **)0xe3ef3f,
                 (char (*) [13])&Guard,
                 (char **)
                 "\' is already present in the archive. All objects must use distinct names.",in_R9)
      ;
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar7 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(2,uVar7,0);
      }
      std::__cxx11::string::~string((string *)local_f8);
      pObject_local._7_1_ = 0;
    }
    else {
LAB_00210a0a:
      pObject_local._7_1_ = 1;
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it_inserted.second);
  }
  RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::~RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> *)((long)&msg_1.field_2 + 8))
  ;
LAB_00210a4a:
  return (bool)(pObject_local._7_1_ & 1);
}

Assistant:

bool AddObjectToArchive(IfaceType*                                                           pObject,
                        const char*                                                          ObjectTypeStr,
                        const INTERFACE_ID&                                                  SerializedObjIID,
                        std::mutex&                                                          Mtx,
                        std::unordered_map<HashMapStringKey, RefCntAutoPtr<ObjectImplType>>& Objects)
{
    DEV_CHECK_ERR(pObject != nullptr, ObjectTypeStr, " must not be null");
    if (pObject == nullptr)
        return false;

    RefCntAutoPtr<ObjectImplType> pSerializedObj{pObject, SerializedObjIID};
    if (!pSerializedObj)
    {
        UNEXPECTED(ObjectTypeStr, " '", pObject->GetDesc().Name, "' was not created by a serialization device.");
        return false;
    }
    const auto* Name = pSerializedObj->GetDesc().Name;

    std::lock_guard<std::mutex> Guard{Mtx};

    auto it_inserted = Objects.emplace(HashMapStringKey{Name, true}, pSerializedObj);
    if (!it_inserted.second && it_inserted.first->second != pSerializedObj)
    {
        if (*it_inserted.first->second != *pSerializedObj)
        {
            LOG_ERROR_MESSAGE(ObjectTypeStr, " with name '", Name, "' is already present in the archive. All objects must use distinct names.");
            return false;
        }
    }

    return true;
}